

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResupplyOfferPdu.cpp
# Opt level: O2

bool __thiscall DIS::ResupplyOfferPdu::operator==(ResupplyOfferPdu *this,ResupplyOfferPdu *rhs)

{
  pointer pSVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  size_t idx;
  ulong uVar5;
  long lVar6;
  
  bVar2 = LogisticsFamilyPdu::operator==
                    (&this->super_LogisticsFamilyPdu,&rhs->super_LogisticsFamilyPdu);
  bVar3 = EntityID::operator==(&this->_receivingEntityID,&rhs->_receivingEntityID);
  bVar4 = EntityID::operator==(&this->_supplyingEntityID,&rhs->_supplyingEntityID);
  bVar2 = this->_padding2 == rhs->_padding2 &&
          (this->_padding1 == rhs->_padding1 && (bVar4 && (bVar3 && bVar2)));
  lVar6 = 0;
  for (uVar5 = 0;
      pSVar1 = (this->_supplies).
               super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>._M_impl
               .super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->_supplies).
                            super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 5);
      uVar5 = uVar5 + 1) {
    bVar3 = SupplyQuantity::operator==
                      ((SupplyQuantity *)((long)&pSVar1->_vptr_SupplyQuantity + lVar6),
                       (SupplyQuantity *)
                       ((long)&((rhs->_supplies).
                                super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_vptr_SupplyQuantity +
                       lVar6));
    bVar2 = (bool)(bVar2 & bVar3);
    lVar6 = lVar6 + 0x20;
  }
  return bVar2;
}

Assistant:

bool ResupplyOfferPdu::operator ==(const ResupplyOfferPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = LogisticsFamilyPdu::operator==(rhs);

     if( ! (_receivingEntityID == rhs._receivingEntityID) ) ivarsEqual = false;
     if( ! (_supplyingEntityID == rhs._supplyingEntityID) ) ivarsEqual = false;
     if( ! (_padding1 == rhs._padding1) ) ivarsEqual = false;
     if( ! (_padding2 == rhs._padding2) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _supplies.size(); idx++)
     {
        if( ! ( _supplies[idx] == rhs._supplies[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }